

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAiger.c
# Opt level: O0

void Gia_AigerWrite(Gia_Man_t *pInit,char *pFileName,int fWriteSymbols,int fCompact)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  FILE *__stream;
  char *pcVar7;
  uchar *pBuffer_00;
  Gia_Obj_t *pGVar8;
  void *pvVar9;
  Vec_Str_t *pVVar10;
  float *pfVar11;
  int *piVar12;
  Vec_Int_t *pVVar13;
  size_t sVar14;
  bool bVar15;
  int local_cc;
  int local_a4;
  int local_a0;
  int nPairs;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  Vec_Int_t *vPairs;
  float *pTimes;
  Vec_Str_t *vBinary;
  Vec_Int_t *vLits;
  uint uLit;
  uint uLit1;
  uint uLit0;
  uchar *pBuffer;
  int Pos;
  int nBufferSize;
  int i;
  Vec_Str_t *vStrExt;
  Gia_Obj_t *pObj;
  Gia_Man_t *p;
  FILE *pFile;
  int fVerbose;
  int fCompact_local;
  int fWriteSymbols_local;
  char *pFileName_local;
  Gia_Man_t *pInit_local;
  
  if ((pInit->nXors != 0) || (pInit->nMuxes != 0)) {
    __assert_fail("pInit->nXors == 0 && pInit->nMuxes == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                  ,0x441,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
  }
  iVar1 = Gia_ManCoNum(pInit);
  if (iVar1 == 0) {
    printf("AIG cannot be written because it has no POs.\n");
  }
  else {
    __stream = fopen(pFileName,"wb");
    if (__stream != (FILE *)0x0) {
      iVar1 = Gia_ManIsNormalized(pInit);
      pObj = (Gia_Obj_t *)pInit;
      if (iVar1 == 0) {
        pObj = (Gia_Obj_t *)Gia_ManDupNormalize(pInit,0);
        Gia_ManTransferMapping((Gia_Man_t *)pObj,pInit);
        Gia_ManTransferPacking((Gia_Man_t *)pObj,pInit);
        Gia_ManTransferTiming((Gia_Man_t *)pObj,pInit);
        ((Gia_Man_t *)pObj)->vNamesIn = pInit->vNamesIn;
        pInit->vNamesIn = (Vec_Ptr_t *)0x0;
        ((Gia_Man_t *)pObj)->vNamesOut = pInit->vNamesOut;
        pInit->vNamesOut = (Vec_Ptr_t *)0x0;
        ((Gia_Man_t *)pObj)->nConstrs = pInit->nConstrs;
        pInit->nConstrs = 0;
      }
      pcVar7 = "";
      if (fCompact != 0) {
        pcVar7 = "2";
      }
      iVar1 = Gia_ManCiNum((Gia_Man_t *)pObj);
      iVar2 = Gia_ManAndNum((Gia_Man_t *)pObj);
      uVar3 = Gia_ManPiNum((Gia_Man_t *)pObj);
      uVar4 = Gia_ManRegNum((Gia_Man_t *)pObj);
      iVar5 = Gia_ManConstrNum((Gia_Man_t *)pObj);
      if (iVar5 == 0) {
        local_cc = Gia_ManPoNum((Gia_Man_t *)pObj);
      }
      else {
        local_cc = 0;
      }
      iVar5 = Gia_ManAndNum((Gia_Man_t *)pObj);
      fprintf(__stream,"aig%s %u %u %u %u %u",pcVar7,(ulong)(uint)(iVar1 + iVar2),(ulong)uVar3,
              (ulong)uVar4,local_cc,iVar5);
      iVar1 = Gia_ManConstrNum((Gia_Man_t *)pObj);
      if (iVar1 != 0) {
        iVar1 = Gia_ManPoNum((Gia_Man_t *)pObj);
        iVar2 = Gia_ManConstrNum((Gia_Man_t *)pObj);
        uVar3 = Gia_ManConstrNum((Gia_Man_t *)pObj);
        fprintf(__stream," %u %u",(ulong)(uint)(iVar1 - iVar2),(ulong)uVar3);
      }
      fprintf(__stream,"\n");
      Gia_ManInvertConstraints((Gia_Man_t *)pObj);
      if (fCompact == 0) {
        Pos = 0;
        while( true ) {
          iVar1 = Gia_ManRegNum((Gia_Man_t *)pObj);
          bVar15 = false;
          if (Pos < iVar1) {
            iVar1 = Gia_ManPoNum((Gia_Man_t *)pObj);
            vStrExt = (Vec_Str_t *)Gia_ManCo((Gia_Man_t *)pObj,iVar1 + Pos);
            bVar15 = vStrExt != (Vec_Str_t *)0x0;
          }
          if (!bVar15) break;
          uVar3 = Gia_ObjFaninLit0p((Gia_Man_t *)pObj,(Gia_Obj_t *)vStrExt);
          fprintf(__stream,"%u\n",(ulong)uVar3);
          Pos = Pos + 1;
        }
        Pos = 0;
        while( true ) {
          iVar1 = Gia_ManPoNum((Gia_Man_t *)pObj);
          bVar15 = false;
          if (Pos < iVar1) {
            vStrExt = (Vec_Str_t *)Gia_ManCo((Gia_Man_t *)pObj,Pos);
            bVar15 = vStrExt != (Vec_Str_t *)0x0;
          }
          if (!bVar15) break;
          uVar3 = Gia_ObjFaninLit0p((Gia_Man_t *)pObj,(Gia_Obj_t *)vStrExt);
          fprintf(__stream,"%u\n",(ulong)uVar3);
          Pos = Pos + 1;
        }
      }
      else {
        pVVar13 = Gia_AigerCollectLiterals((Gia_Man_t *)pObj);
        pVVar10 = Gia_AigerWriteLiterals(pVVar13);
        pcVar7 = Vec_StrArray(pVVar10);
        iVar1 = Vec_StrSize(pVVar10);
        fwrite(pcVar7,1,(long)iVar1,__stream);
        Vec_StrFree(pVVar10);
        Vec_IntFree(pVVar13);
      }
      Gia_ManInvertConstraints((Gia_Man_t *)pObj);
      pBuffer._4_4_ = 0;
      iVar1 = Gia_ManAndNum((Gia_Man_t *)pObj);
      iVar2 = iVar1 * 8 + 100;
      pBuffer_00 = (uchar *)malloc((long)iVar2);
      Pos = 0;
      while( true ) {
        bVar15 = false;
        if (Pos < *(int *)(pObj + 2)) {
          vStrExt = (Vec_Str_t *)Gia_ManObj((Gia_Man_t *)pObj,Pos);
          bVar15 = vStrExt != (Vec_Str_t *)0x0;
        }
        if (!bVar15) break;
        iVar5 = Gia_ObjIsAnd((Gia_Obj_t *)vStrExt);
        if (iVar5 != 0) {
          iVar5 = Abc_Var2Lit(Pos,0);
          uVar3 = Gia_ObjFaninLit0((Gia_Obj_t *)vStrExt,Pos);
          uVar4 = Gia_ObjFaninLit1((Gia_Obj_t *)vStrExt,Pos);
          if (((*(int *)&pObj[8].field_0x4 == 0) &&
              (iVar6 = Gia_ManBufNum((Gia_Man_t *)pObj), iVar6 == 0)) && (uVar4 <= uVar3)) {
            __assert_fail("p->fGiaSimple || Gia_ManBufNum(p) || uLit0 < uLit1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                          ,0x48a,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
          }
          iVar5 = Gia_AigerWriteUnsignedBuffer(pBuffer_00,pBuffer._4_4_,iVar5 - uVar4);
          pBuffer._4_4_ = Gia_AigerWriteUnsignedBuffer(pBuffer_00,iVar5,uVar4 - uVar3);
          if (iVar1 * 8 + 0x5a < pBuffer._4_4_) {
            printf(
                  "Gia_AigerWrite(): AIGER generation has failed because the allocated buffer is too small.\n"
                  );
            fclose(__stream);
            if ((Gia_Man_t *)pObj == pInit) {
              return;
            }
            Gia_ManStop((Gia_Man_t *)pObj);
            return;
          }
        }
        Pos = Pos + 1;
      }
      if (iVar2 <= pBuffer._4_4_) {
        __assert_fail("Pos < nBufferSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                      ,0x496,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
      }
      fwrite(pBuffer_00,1,(long)pBuffer._4_4_,__stream);
      if (pBuffer_00 != (uchar *)0x0) {
        free(pBuffer_00);
      }
      if ((*(long *)&pObj[0x2b].field_0x4 != 0) && (*(long *)(pObj + 0x2c) != 0)) {
        iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)&pObj[0x2b].field_0x4);
        iVar2 = Gia_ManCiNum((Gia_Man_t *)pObj);
        if (iVar1 != iVar2) {
          __assert_fail("Vec_PtrSize(p->vNamesIn) == Gia_ManCiNum(p)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                        ,0x49f,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
        }
        iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)(pObj + 0x2c));
        iVar2 = Gia_ManCoNum((Gia_Man_t *)pObj);
        if (iVar1 != iVar2) {
          __assert_fail("Vec_PtrSize(p->vNamesOut) == Gia_ManCoNum(p)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                        ,0x4a0,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
        }
        Pos = 0;
        while( true ) {
          iVar1 = Gia_ManPiNum((Gia_Man_t *)pObj);
          bVar15 = false;
          if (Pos < iVar1) {
            pGVar8 = Gia_ManCi((Gia_Man_t *)pObj,Pos);
            bVar15 = pGVar8 != (Gia_Obj_t *)0x0;
          }
          if (!bVar15) break;
          pvVar9 = Vec_PtrEntry(*(Vec_Ptr_t **)&pObj[0x2b].field_0x4,Pos);
          fprintf(__stream,"i%d %s\n",(ulong)(uint)Pos,pvVar9);
          Pos = Pos + 1;
        }
        Pos = 0;
        while( true ) {
          iVar1 = Gia_ManRegNum((Gia_Man_t *)pObj);
          bVar15 = false;
          if (Pos < iVar1) {
            iVar1 = Gia_ManPiNum((Gia_Man_t *)pObj);
            pGVar8 = Gia_ManCi((Gia_Man_t *)pObj,iVar1 + Pos);
            bVar15 = pGVar8 != (Gia_Obj_t *)0x0;
          }
          if (!bVar15) break;
          p_00 = *(Vec_Ptr_t **)&pObj[0x2b].field_0x4;
          iVar1 = Gia_ManPiNum((Gia_Man_t *)pObj);
          pvVar9 = Vec_PtrEntry(p_00,iVar1 + Pos);
          fprintf(__stream,"l%d %s\n",(ulong)(uint)Pos,pvVar9);
          Pos = Pos + 1;
        }
        Pos = 0;
        while( true ) {
          iVar1 = Gia_ManPoNum((Gia_Man_t *)pObj);
          bVar15 = false;
          if (Pos < iVar1) {
            pGVar8 = Gia_ManCo((Gia_Man_t *)pObj,Pos);
            bVar15 = pGVar8 != (Gia_Obj_t *)0x0;
          }
          if (!bVar15) break;
          pvVar9 = Vec_PtrEntry(*(Vec_Ptr_t **)(pObj + 0x2c),Pos);
          fprintf(__stream,"o%d %s\n",(ulong)(uint)Pos,pvVar9);
          Pos = Pos + 1;
        }
      }
      fprintf(__stream,"c");
      if (*(long *)&pObj[0x26].Value != 0) {
        fprintf(__stream,"a");
        pVVar10 = Gia_AigerWriteIntoMemoryStr(*(Gia_Man_t **)&pObj[0x26].Value);
        iVar1 = Vec_StrSize(pVVar10);
        Gia_FileWriteBufferSize((FILE *)__stream,iVar1);
        pcVar7 = Vec_StrArray(pVVar10);
        iVar1 = Vec_StrSize(pVVar10);
        fwrite(pcVar7,1,(long)iVar1,__stream);
        Vec_StrFree(pVVar10);
      }
      if (*(int *)(pObj + 0xb) != 0) {
        fprintf(__stream,"c");
        Gia_FileWriteBufferSize((FILE *)__stream,4);
        Gia_FileWriteBufferSize((FILE *)__stream,*(int *)(pObj + 0xb));
      }
      if (pObj[0x36].Value != 0) {
        fprintf(__stream,"d");
        Gia_FileWriteBufferSize((FILE *)__stream,4);
        Gia_FileWriteBufferSize((FILE *)__stream,pObj[0x36].Value);
      }
      if (*(long *)(pObj + 0x32) != 0) {
        pfVar11 = Tim_ManGetArrTimes(*(Tim_Man_t **)(pObj + 0x32));
        if (pfVar11 != (float *)0x0) {
          fprintf(__stream,"i");
          iVar1 = Tim_ManPiNum(*(Tim_Man_t **)(pObj + 0x32));
          Gia_FileWriteBufferSize((FILE *)__stream,iVar1 << 2);
          iVar1 = Tim_ManPiNum(*(Tim_Man_t **)(pObj + 0x32));
          fwrite(pfVar11,1,(long)(iVar1 << 2),__stream);
          if (pfVar11 != (float *)0x0) {
            free(pfVar11);
          }
        }
        pfVar11 = Tim_ManGetReqTimes(*(Tim_Man_t **)(pObj + 0x32));
        if (pfVar11 != (float *)0x0) {
          fprintf(__stream,"o");
          iVar1 = Tim_ManPoNum(*(Tim_Man_t **)(pObj + 0x32));
          Gia_FileWriteBufferSize((FILE *)__stream,iVar1 << 2);
          iVar1 = Tim_ManPoNum(*(Tim_Man_t **)(pObj + 0x32));
          fwrite(pfVar11,1,(long)(iVar1 << 2),__stream);
          if (pfVar11 != (float *)0x0) {
            free(pfVar11);
          }
        }
      }
      if ((*(long *)&pObj[0xc].Value != 0) && (*(long *)&pObj[0xd].field_0x4 != 0)) {
        fprintf(__stream,"e");
        pVVar10 = Gia_WriteEquivClasses((Gia_Man_t *)pObj);
        iVar1 = Vec_StrSize(pVVar10);
        Gia_FileWriteBufferSize((FILE *)__stream,iVar1);
        pcVar7 = Vec_StrArray(pVVar10);
        iVar1 = Vec_StrSize(pVVar10);
        fwrite(pcVar7,1,(long)iVar1,__stream);
        Vec_StrFree(pVVar10);
      }
      if (*(long *)&pObj[0x1f].field_0x4 != 0) {
        fprintf(__stream,"f");
        iVar1 = Gia_ManRegNum((Gia_Man_t *)pObj);
        Gia_FileWriteBufferSize((FILE *)__stream,iVar1 << 2);
        iVar1 = Vec_IntSize(*(Vec_Int_t **)&pObj[0x1f].field_0x4);
        iVar2 = Gia_ManRegNum((Gia_Man_t *)pObj);
        if (iVar1 != iVar2) {
          __assert_fail("Vec_IntSize(p->vFlopClasses) == Gia_ManRegNum(p)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                        ,0x4ed,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
        }
        piVar12 = Vec_IntArray(*(Vec_Int_t **)&pObj[0x1f].field_0x4);
        iVar1 = Gia_ManRegNum((Gia_Man_t *)pObj);
        fwrite(piVar12,1,(long)(iVar1 << 2),__stream);
      }
      if (*(long *)(pObj + 0x20) != 0) {
        fprintf(__stream,"g");
        iVar1 = Gia_ManObjNum((Gia_Man_t *)pObj);
        Gia_FileWriteBufferSize((FILE *)__stream,iVar1 << 2);
        iVar1 = Vec_IntSize(*(Vec_Int_t **)(pObj + 0x20));
        iVar2 = Gia_ManObjNum((Gia_Man_t *)pObj);
        if (iVar1 != iVar2) {
          __assert_fail("Vec_IntSize(p->vGateClasses) == Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                        ,0x4f5,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
        }
        piVar12 = Vec_IntArray(*(Vec_Int_t **)(pObj + 0x20));
        iVar1 = Gia_ManObjNum((Gia_Man_t *)pObj);
        fwrite(piVar12,1,(long)(iVar1 << 2),__stream);
      }
      if (*(long *)(pObj + 0x32) != 0) {
        fprintf(__stream,"h");
        pVVar10 = Tim_ManSave(*(Tim_Man_t **)(pObj + 0x32),1);
        iVar1 = Vec_StrSize(pVVar10);
        Gia_FileWriteBufferSize((FILE *)__stream,iVar1);
        pcVar7 = Vec_StrArray(pVVar10);
        iVar1 = Vec_StrSize(pVVar10);
        fwrite(pcVar7,1,(long)iVar1,__stream);
        Vec_StrFree(pVVar10);
      }
      if (*(long *)(pObj + 0x16) != 0) {
        fprintf(__stream,"k");
        pVVar10 = Gia_WritePacking(*(Vec_Int_t **)(pObj + 0x16));
        iVar1 = Vec_StrSize(pVVar10);
        Gia_FileWriteBufferSize((FILE *)__stream,iVar1);
        pcVar7 = Vec_StrArray(pVVar10);
        iVar1 = Vec_StrSize(pVVar10);
        fwrite(pcVar7,1,(long)iVar1,__stream);
        Vec_StrFree(pVVar10);
      }
      if (*(long *)(pObj + 0x1a) != 0) {
        pVVar13 = Gia_ManEdgeToArray((Gia_Man_t *)pObj);
        fprintf(__stream,"w");
        iVar1 = Vec_IntSize(pVVar13);
        Gia_FileWriteBufferSize((FILE *)__stream,(iVar1 + 1) * 4);
        iVar1 = Vec_IntSize(pVVar13);
        Gia_FileWriteBufferSize((FILE *)__stream,iVar1 / 2);
        for (i_3 = 0; iVar1 = Vec_IntSize(pVVar13), i_3 < iVar1; i_3 = i_3 + 1) {
          iVar1 = Vec_IntEntry(pVVar13,i_3);
          Gia_FileWriteBufferSize((FILE *)__stream,iVar1);
        }
        Vec_IntFree(pVVar13);
      }
      iVar1 = Gia_ManHasMapping((Gia_Man_t *)pObj);
      if (iVar1 != 0) {
        fprintf(__stream,"m");
        pVVar10 = Gia_AigerWriteMappingDoc((Gia_Man_t *)pObj);
        iVar1 = Vec_StrSize(pVVar10);
        Gia_FileWriteBufferSize((FILE *)__stream,iVar1);
        pcVar7 = Vec_StrArray(pVVar10);
        iVar1 = Vec_StrSize(pVVar10);
        fwrite(pcVar7,1,(long)iVar1,__stream);
        Vec_StrFree(pVVar10);
      }
      if (*(long *)(pObj + 0x26) != 0) {
        fprintf(__stream,"p");
        iVar1 = Gia_ManObjNum((Gia_Man_t *)pObj);
        Gia_FileWriteBufferSize((FILE *)__stream,iVar1 << 2);
        pvVar9 = *(void **)(pObj + 0x26);
        iVar1 = Gia_ManObjNum((Gia_Man_t *)pObj);
        fwrite(pvVar9,1,(long)(iVar1 << 2),__stream);
      }
      if (*(long *)(pObj + 0x22) != 0) {
        fprintf(__stream,"r");
        iVar1 = Vec_IntSize(*(Vec_Int_t **)(pObj + 0x22));
        Gia_FileWriteBufferSize((FILE *)__stream,(iVar1 + 1) * 4);
        iVar1 = Vec_IntSize(*(Vec_Int_t **)(pObj + 0x22));
        Gia_FileWriteBufferSize((FILE *)__stream,iVar1);
        for (i_4 = 0; iVar1 = Vec_IntSize(*(Vec_Int_t **)(pObj + 0x22)), i_4 < iVar1; i_4 = i_4 + 1)
        {
          iVar1 = Vec_IntEntry(*(Vec_Int_t **)(pObj + 0x22),i_4);
          Gia_FileWriteBufferSize((FILE *)__stream,iVar1);
        }
      }
      if (*(long *)&pObj[0x22].Value != 0) {
        fprintf(__stream,"s");
        iVar1 = Vec_IntSize(*(Vec_Int_t **)&pObj[0x22].Value);
        Gia_FileWriteBufferSize((FILE *)__stream,(iVar1 + 1) * 4);
        iVar1 = Vec_IntSize(*(Vec_Int_t **)&pObj[0x22].Value);
        Gia_FileWriteBufferSize((FILE *)__stream,iVar1);
        for (nPairs = 0; iVar1 = Vec_IntSize(*(Vec_Int_t **)&pObj[0x22].Value), nPairs < iVar1;
            nPairs = nPairs + 1) {
          iVar1 = Vec_IntEntry(*(Vec_Int_t **)&pObj[0x22].Value,nPairs);
          Gia_FileWriteBufferSize((FILE *)__stream,iVar1);
        }
      }
      if (*(long *)&pObj[0x16].Value != 0) {
        fprintf(__stream,"b");
        if (*(long *)&pObj[0x17].field_0x4 == 0) {
          __assert_fail("p->pCellStr != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                        ,0x545,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
        }
        iVar1 = Vec_IntSize(*(Vec_Int_t **)&pObj[0x16].Value);
        sVar14 = strlen(*(char **)&pObj[0x17].field_0x4);
        Gia_FileWriteBufferSize((FILE *)__stream,iVar1 * 4 + (int)sVar14 + 1);
        pvVar9 = *(void **)&pObj[0x17].field_0x4;
        sVar14 = strlen(*(char **)&pObj[0x17].field_0x4);
        fwrite(pvVar9,1,sVar14 + 1,__stream);
        for (Pos = 0; iVar1 = Vec_IntSize(*(Vec_Int_t **)&pObj[0x16].Value), Pos < iVar1;
            Pos = Pos + 1) {
          iVar1 = Vec_IntEntry(*(Vec_Int_t **)&pObj[0x16].Value,Pos);
          Gia_FileWriteBufferSize((FILE *)__stream,iVar1);
        }
      }
      iVar1 = Gia_ManHasChoices((Gia_Man_t *)pObj);
      if (iVar1 != 0) {
        local_a4 = 0;
        fprintf(__stream,"q");
        for (local_a0 = 0; iVar1 = Gia_ManObjNum((Gia_Man_t *)pObj), local_a0 < iVar1;
            local_a0 = local_a0 + 1) {
          iVar1 = Gia_ObjSibl((Gia_Man_t *)pObj,local_a0);
          local_a4 = (uint)(0 < iVar1) + local_a4;
        }
        Gia_FileWriteBufferSize((FILE *)__stream,(local_a4 * 2 + 1) * 4);
        Gia_FileWriteBufferSize((FILE *)__stream,local_a4);
        for (local_a0 = 0; iVar1 = Gia_ManObjNum((Gia_Man_t *)pObj), local_a0 < iVar1;
            local_a0 = local_a0 + 1) {
          iVar1 = Gia_ObjSibl((Gia_Man_t *)pObj,local_a0);
          if (iVar1 != 0) {
            iVar1 = Gia_ObjSibl((Gia_Man_t *)pObj,local_a0);
            if (local_a0 <= iVar1) {
              __assert_fail("i > Gia_ObjSibl(p, i)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                            ,0x558,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
            }
            Gia_FileWriteBufferSize((FILE *)__stream,local_a0);
            iVar1 = Gia_ObjSibl((Gia_Man_t *)pObj,local_a0);
            Gia_FileWriteBufferSize((FILE *)__stream,iVar1);
          }
        }
      }
      if (*(long *)&pObj[0x25].field_0x4 != 0) {
        fprintf(__stream,"u");
        iVar1 = Gia_ManObjNum((Gia_Man_t *)pObj);
        Gia_FileWriteBufferSize((FILE *)__stream,iVar1);
        pvVar9 = *(void **)&pObj[0x25].field_0x4;
        iVar1 = Gia_ManObjNum((Gia_Man_t *)pObj);
        fwrite(pvVar9,1,(long)iVar1,__stream);
      }
      if (*(long *)&pObj[0x20].Value != 0) {
        fprintf(__stream,"v");
        iVar1 = Gia_ManObjNum((Gia_Man_t *)pObj);
        Gia_FileWriteBufferSize((FILE *)__stream,iVar1 << 2);
        iVar1 = Vec_IntSize(*(Vec_Int_t **)&pObj[0x20].Value);
        iVar2 = Gia_ManObjNum((Gia_Man_t *)pObj);
        if (iVar1 != iVar2) {
          __assert_fail("Vec_IntSize(p->vObjClasses) == Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                        ,0x575,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
        }
        piVar12 = Vec_IntArray(*(Vec_Int_t **)&pObj[0x20].Value);
        iVar1 = Gia_ManObjNum((Gia_Man_t *)pObj);
        fwrite(piVar12,1,(long)(iVar1 << 2),__stream);
      }
      if (*(long *)pObj != 0) {
        fprintf(__stream,"n");
        sVar14 = strlen(*(char **)pObj);
        Gia_FileWriteBufferSize((FILE *)__stream,(int)sVar14 + 1);
        pvVar9 = *(void **)pObj;
        sVar14 = strlen(*(char **)pObj);
        fwrite(pvVar9,1,sVar14,__stream);
        fprintf(__stream,"%c",0);
      }
      pcVar7 = Gia_TimeStamp();
      fprintf(__stream,"\nThis file was produced by the GIA package in ABC on %s\n",pcVar7);
      fprintf(__stream,"For information about AIGER format, refer to %s\n","http://fmv.jku.at/aiger"
             );
      fclose(__stream);
      if ((Gia_Man_t *)pObj == pInit) {
        return;
      }
      pInit->pManTime = *(void **)(pObj + 0x32);
      *(undefined8 *)(pObj + 0x32) = 0;
      pInit->vNamesIn = *(Vec_Ptr_t **)&pObj[0x2b].field_0x4;
      *(undefined8 *)&pObj[0x2b].field_0x4 = 0;
      pInit->vNamesOut = *(Vec_Ptr_t **)(pObj + 0x2c);
      *(undefined8 *)(pObj + 0x2c) = 0;
      Gia_ManStop((Gia_Man_t *)pObj);
      return;
    }
    fprintf(_stdout,"Gia_AigerWrite(): Cannot open the output file \"%s\".\n",pFileName);
  }
  return;
}

Assistant:

void Gia_AigerWrite( Gia_Man_t * pInit, char * pFileName, int fWriteSymbols, int fCompact )
{
    int fVerbose = XAIG_VERBOSE;
    FILE * pFile;
    Gia_Man_t * p;
    Gia_Obj_t * pObj;
    Vec_Str_t * vStrExt;
    int i, nBufferSize, Pos;
    unsigned char * pBuffer;
    unsigned uLit0, uLit1, uLit;
    assert( pInit->nXors == 0 && pInit->nMuxes == 0 );

    if ( Gia_ManCoNum(pInit) == 0 )
    {
        printf( "AIG cannot be written because it has no POs.\n" );
        return;
    }

    // start the output stream
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Gia_AigerWrite(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    // create normalized AIG
    if ( !Gia_ManIsNormalized(pInit) )
    {
//        printf( "Gia_AigerWrite(): Normalizing AIG for writing.\n" );
        p = Gia_ManDupNormalize( pInit, 0 );
		Gia_ManTransferMapping( p, pInit );
	    Gia_ManTransferPacking( p, pInit );
        Gia_ManTransferTiming( p, pInit );
        p->vNamesIn   = pInit->vNamesIn;   pInit->vNamesIn   = NULL;
        p->vNamesOut  = pInit->vNamesOut;  pInit->vNamesOut  = NULL;
        p->nConstrs   = pInit->nConstrs;   pInit->nConstrs   = 0;
    }
    else
        p = pInit;

    // write the header "M I L O A" where M = I + L + A
    fprintf( pFile, "aig%s %u %u %u %u %u", 
        fCompact? "2" : "",
        Gia_ManCiNum(p) + Gia_ManAndNum(p), 
        Gia_ManPiNum(p),
        Gia_ManRegNum(p),
        Gia_ManConstrNum(p) ? 0 : Gia_ManPoNum(p),
        Gia_ManAndNum(p) );
    // write the extended header "B C J F"
    if ( Gia_ManConstrNum(p) )
        fprintf( pFile, " %u %u", Gia_ManPoNum(p) - Gia_ManConstrNum(p), Gia_ManConstrNum(p) );
    fprintf( pFile, "\n" ); 

    Gia_ManInvertConstraints( p );
    if ( !fCompact ) 
    {
        // write latch drivers
        Gia_ManForEachRi( p, pObj, i )
            fprintf( pFile, "%u\n", Gia_ObjFaninLit0p(p, pObj) );
        // write PO drivers
        Gia_ManForEachPo( p, pObj, i )
            fprintf( pFile, "%u\n", Gia_ObjFaninLit0p(p, pObj) );
    }
    else
    {
        Vec_Int_t * vLits = Gia_AigerCollectLiterals( p );
        Vec_Str_t * vBinary = Gia_AigerWriteLiterals( vLits );
        fwrite( Vec_StrArray(vBinary), 1, Vec_StrSize(vBinary), pFile );
        Vec_StrFree( vBinary );
        Vec_IntFree( vLits );
    }
    Gia_ManInvertConstraints( p );

    // write the nodes into the buffer
    Pos = 0;
    nBufferSize = 8 * Gia_ManAndNum(p) + 100; // skeptically assuming 3 chars per one AIG edge
    pBuffer = ABC_ALLOC( unsigned char, nBufferSize );
    Gia_ManForEachAnd( p, pObj, i )
    {
        uLit  = Abc_Var2Lit( i, 0 );
        uLit0 = Gia_ObjFaninLit0( pObj, i );
        uLit1 = Gia_ObjFaninLit1( pObj, i );
        assert( p->fGiaSimple || Gia_ManBufNum(p) || uLit0 < uLit1 );
        Pos = Gia_AigerWriteUnsignedBuffer( pBuffer, Pos, uLit  - uLit1 );
        Pos = Gia_AigerWriteUnsignedBuffer( pBuffer, Pos, uLit1 - uLit0 );
        if ( Pos > nBufferSize - 10 )
        {
            printf( "Gia_AigerWrite(): AIGER generation has failed because the allocated buffer is too small.\n" );
	        fclose( pFile );
            if ( p != pInit )
                Gia_ManStop( p );
            return;
        }
    }
    assert( Pos < nBufferSize );

    // write the buffer
    fwrite( pBuffer, 1, Pos, pFile );
    ABC_FREE( pBuffer );

    // write the symbol table
    if ( p->vNamesIn && p->vNamesOut )
    {
        assert( Vec_PtrSize(p->vNamesIn)  == Gia_ManCiNum(p) );
        assert( Vec_PtrSize(p->vNamesOut) == Gia_ManCoNum(p) );
        // write PIs
        Gia_ManForEachPi( p, pObj, i )
            fprintf( pFile, "i%d %s\n", i, (char *)Vec_PtrEntry(p->vNamesIn, i) );
        // write latches
        Gia_ManForEachRo( p, pObj, i )
            fprintf( pFile, "l%d %s\n", i, (char *)Vec_PtrEntry(p->vNamesIn, Gia_ManPiNum(p) + i) );
        // write POs
        Gia_ManForEachPo( p, pObj, i )
            fprintf( pFile, "o%d %s\n", i, (char *)Vec_PtrEntry(p->vNamesOut, i) );
    }

    // write the comment
//    fprintf( pFile, "c\n" );
    fprintf( pFile, "c" );

    // write additional AIG
    if ( p->pAigExtra )
    {
        fprintf( pFile, "a" );
        vStrExt = Gia_AigerWriteIntoMemoryStr( p->pAigExtra );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
        if ( fVerbose ) printf( "Finished writing extension \"a\".\n" );
    }
    // write constraints
    if ( p->nConstrs )
    {
        fprintf( pFile, "c" );
        Gia_FileWriteBufferSize( pFile, 4 );
        Gia_FileWriteBufferSize( pFile, p->nConstrs );
    }
    // write timing information
    if ( p->nAnd2Delay )
    {
        fprintf( pFile, "d" );
        Gia_FileWriteBufferSize( pFile, 4 );
        Gia_FileWriteBufferSize( pFile, p->nAnd2Delay );
    }
    if ( p->pManTime )
    {
        float * pTimes;
        pTimes = Tim_ManGetArrTimes( (Tim_Man_t *)p->pManTime );
        if ( pTimes )
        {
            fprintf( pFile, "i" );
            Gia_FileWriteBufferSize( pFile, 4*Tim_ManPiNum((Tim_Man_t *)p->pManTime) );
            fwrite( pTimes, 1, 4*Tim_ManPiNum((Tim_Man_t *)p->pManTime), pFile );
            ABC_FREE( pTimes );
            if ( fVerbose ) printf( "Finished writing extension \"i\".\n" );
        }
        pTimes = Tim_ManGetReqTimes( (Tim_Man_t *)p->pManTime );
        if ( pTimes )
        {
            fprintf( pFile, "o" );
            Gia_FileWriteBufferSize( pFile, 4*Tim_ManPoNum((Tim_Man_t *)p->pManTime) );
            fwrite( pTimes, 1, 4*Tim_ManPoNum((Tim_Man_t *)p->pManTime), pFile );
            ABC_FREE( pTimes );
            if ( fVerbose ) printf( "Finished writing extension \"o\".\n" );
        }
    }
    // write equivalences
    if ( p->pReprs && p->pNexts )
    {
        extern Vec_Str_t * Gia_WriteEquivClasses( Gia_Man_t * p );
        fprintf( pFile, "e" );
        vStrExt = Gia_WriteEquivClasses( p );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
    }
    // write flop classes
    if ( p->vFlopClasses )
    {
        fprintf( pFile, "f" );
        Gia_FileWriteBufferSize( pFile, 4*Gia_ManRegNum(p) );
        assert( Vec_IntSize(p->vFlopClasses) == Gia_ManRegNum(p) );
        fwrite( Vec_IntArray(p->vFlopClasses), 1, 4*Gia_ManRegNum(p), pFile );
    }
    // write gate classes
    if ( p->vGateClasses )
    {
        fprintf( pFile, "g" );
        Gia_FileWriteBufferSize( pFile, 4*Gia_ManObjNum(p) );
        assert( Vec_IntSize(p->vGateClasses) == Gia_ManObjNum(p) );
        fwrite( Vec_IntArray(p->vGateClasses), 1, 4*Gia_ManObjNum(p), pFile );
    }
    // write hierarchy info
    if ( p->pManTime )
    {
        fprintf( pFile, "h" );
        vStrExt = Tim_ManSave( (Tim_Man_t *)p->pManTime, 1 );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
        if ( fVerbose ) printf( "Finished writing extension \"h\".\n" );
    }
    // write packing
    if ( p->vPacking )
    {
        extern Vec_Str_t * Gia_WritePacking( Vec_Int_t * vPacking );
        fprintf( pFile, "k" );
        vStrExt = Gia_WritePacking( p->vPacking );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
        if ( fVerbose ) printf( "Finished writing extension \"k\".\n" );
    }
    // write edges
    if ( p->vEdge1 )
    {
        Vec_Int_t * vPairs = Gia_ManEdgeToArray( p );
        int i;
        fprintf( pFile, "w" );
        Gia_FileWriteBufferSize( pFile, 4*(Vec_IntSize(vPairs)+1) );
        Gia_FileWriteBufferSize( pFile, Vec_IntSize(vPairs)/2 );
        for ( i = 0; i < Vec_IntSize(vPairs); i++ )
            Gia_FileWriteBufferSize( pFile, Vec_IntEntry(vPairs, i) );
        Vec_IntFree( vPairs );
    }
    // write mapping
    if ( Gia_ManHasMapping(p) )
    {
        extern Vec_Str_t * Gia_AigerWriteMapping( Gia_Man_t * p );
        extern Vec_Str_t * Gia_AigerWriteMappingSimple( Gia_Man_t * p );
        extern Vec_Str_t * Gia_AigerWriteMappingDoc( Gia_Man_t * p );
        fprintf( pFile, "m" );
        vStrExt = Gia_AigerWriteMappingDoc( p );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
        if ( fVerbose ) printf( "Finished writing extension \"m\".\n" );
    }
    // write placement
    if ( p->pPlacement )
    {
        fprintf( pFile, "p" );
        Gia_FileWriteBufferSize( pFile, 4*Gia_ManObjNum(p) );
        fwrite( p->pPlacement, 1, 4*Gia_ManObjNum(p), pFile );
    }
    // write register classes
    if ( p->vRegClasses )
    {
        int i;
        fprintf( pFile, "r" );
        Gia_FileWriteBufferSize( pFile, 4*(Vec_IntSize(p->vRegClasses)+1) );
        Gia_FileWriteBufferSize( pFile, Vec_IntSize(p->vRegClasses) );
        for ( i = 0; i < Vec_IntSize(p->vRegClasses); i++ )
            Gia_FileWriteBufferSize( pFile, Vec_IntEntry(p->vRegClasses, i) );
    }
    // write register inits
    if ( p->vRegInits )
    {
        int i;
        fprintf( pFile, "s" );
        Gia_FileWriteBufferSize( pFile, 4*(Vec_IntSize(p->vRegInits)+1) );
        Gia_FileWriteBufferSize( pFile, Vec_IntSize(p->vRegInits) );
        for ( i = 0; i < Vec_IntSize(p->vRegInits); i++ )
            Gia_FileWriteBufferSize( pFile, Vec_IntEntry(p->vRegInits, i) );
    }
    // write configuration data
    if ( p->vConfigs )
    {
        fprintf( pFile, "b" );
        assert( p->pCellStr != NULL );
        Gia_FileWriteBufferSize( pFile, 4*Vec_IntSize(p->vConfigs) + strlen(p->pCellStr) + 1 );
        fwrite( p->pCellStr, 1, strlen(p->pCellStr) + 1, pFile );
//        fwrite( Vec_IntArray(p->vConfigs), 1, 4*Vec_IntSize(p->vConfigs), pFile );
        for ( i = 0; i < Vec_IntSize(p->vConfigs); i++ )
            Gia_FileWriteBufferSize( pFile, Vec_IntEntry(p->vConfigs, i) );
    }
    // write choices
    if ( Gia_ManHasChoices(p) )
    {
        int i, nPairs = 0;
        fprintf( pFile, "q" );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            nPairs += (Gia_ObjSibl(p, i) > 0);
        Gia_FileWriteBufferSize( pFile, 4*(nPairs * 2 + 1) );
        Gia_FileWriteBufferSize( pFile, nPairs );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            if ( Gia_ObjSibl(p, i) )
            {
                assert( i > Gia_ObjSibl(p, i) );
                Gia_FileWriteBufferSize( pFile, i );
                Gia_FileWriteBufferSize( pFile, Gia_ObjSibl(p, i) );
            }
        if ( fVerbose ) printf( "Finished writing extension \"q\".\n" );
    }
    // write switching activity
    if ( p->pSwitching )
    {
        fprintf( pFile, "u" );
        Gia_FileWriteBufferSize( pFile, Gia_ManObjNum(p) );
        fwrite( p->pSwitching, 1, Gia_ManObjNum(p), pFile );
    }
/*
    // write timing information
    if ( p->pManTime )
    {
        fprintf( pFile, "t" );
        vStrExt = Tim_ManSave( (Tim_Man_t *)p->pManTime, 0 );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
    }
*/
    // write object classes
    if ( p->vObjClasses )
    {
        fprintf( pFile, "v" );
        Gia_FileWriteBufferSize( pFile, 4*Gia_ManObjNum(p) );
        assert( Vec_IntSize(p->vObjClasses) == Gia_ManObjNum(p) );
        fwrite( Vec_IntArray(p->vObjClasses), 1, 4*Gia_ManObjNum(p), pFile );
    }
    // write name
    if ( p->pName )
    {
        fprintf( pFile, "n" );
        Gia_FileWriteBufferSize( pFile, strlen(p->pName)+1 );
        fwrite( p->pName, 1, strlen(p->pName), pFile );
        fprintf( pFile, "%c", '\0' );
    }
    // write comments
    fprintf( pFile, "\nThis file was produced by the GIA package in ABC on %s\n", Gia_TimeStamp() );
    fprintf( pFile, "For information about AIGER format, refer to %s\n", "http://fmv.jku.at/aiger" );
	fclose( pFile );
    if ( p != pInit )
    {
        pInit->pManTime  = p->pManTime;  p->pManTime = NULL;
        pInit->vNamesIn  = p->vNamesIn;  p->vNamesIn = NULL;
        pInit->vNamesOut = p->vNamesOut; p->vNamesOut = NULL;
        Gia_ManStop( p );
    }
}